

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::absolute_pose::modules::gpnp4::groebnerRow6_0000_f
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  lVar13 = (long)targetRow;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[lVar13 + 600];
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar14 = vxorpd_avx512vl(auVar15,auVar12);
  auVar16._0_8_ =
       auVar14._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x25e];
  auVar16._8_8_ = auVar14._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 600] = 0.0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x277];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[lVar13 + 0x271];
  auVar14 = vfmadd213sd_fma(auVar17,auVar16,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x271] = auVar14._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x290];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 0x28a];
  auVar14 = vfmadd213sd_fma(auVar18,auVar16,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x28a] = auVar14._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2a9];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 0x2a3];
  auVar14 = vfmadd213sd_fma(auVar19,auVar16,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x2a3] = auVar14._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2c2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 700];
  auVar14 = vfmadd213sd_fma(auVar20,auVar16,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 700] = auVar14._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2db];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 0x2d5];
  auVar14 = vfmadd213sd_fma(auVar21,auVar16,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x2d5] = auVar14._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2f4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 0x2ee];
  auVar14 = vfmadd213sd_fma(auVar22,auVar16,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x2ee] = auVar14._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x30d];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 0x307];
  auVar14 = vfmadd213sd_fma(auVar23,auVar16,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x307] = auVar14._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x326];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 800];
  auVar14 = vfmadd213sd_fma(auVar24,auVar16,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 800] = auVar14._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x33f];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 0x339];
  auVar14 = vfmadd213sd_fma(auVar25,auVar16,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x339] = auVar14._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x358];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
                 m_storage.m_data.array[lVar13 + 0x352];
  auVar14 = vfmadd213sd_fma(auVar26,auVar16,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x352] = auVar14._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x371];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[lVar13 + 0x36b];
  auVar14 = vfmadd213sd_fma(auVar27,auVar16,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 0x36b] = auVar14._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x38a];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[lVar13 + 900];
  auVar14 = vfmadd213sd_fma(auVar28,auVar16,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[lVar13 + 900] = auVar14._0_8_;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::groebnerRow6_0000_f( Eigen::Matrix<double,25,37> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,24) / groebnerMatrix(6,24);
  groebnerMatrix(targetRow,24) = 0.0;
  groebnerMatrix(targetRow,25) -= factor * groebnerMatrix(6,25);
  groebnerMatrix(targetRow,26) -= factor * groebnerMatrix(6,26);
  groebnerMatrix(targetRow,27) -= factor * groebnerMatrix(6,27);
  groebnerMatrix(targetRow,28) -= factor * groebnerMatrix(6,28);
  groebnerMatrix(targetRow,29) -= factor * groebnerMatrix(6,29);
  groebnerMatrix(targetRow,30) -= factor * groebnerMatrix(6,30);
  groebnerMatrix(targetRow,31) -= factor * groebnerMatrix(6,31);
  groebnerMatrix(targetRow,32) -= factor * groebnerMatrix(6,32);
  groebnerMatrix(targetRow,33) -= factor * groebnerMatrix(6,33);
  groebnerMatrix(targetRow,34) -= factor * groebnerMatrix(6,34);
  groebnerMatrix(targetRow,35) -= factor * groebnerMatrix(6,35);
  groebnerMatrix(targetRow,36) -= factor * groebnerMatrix(6,36);
}